

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_coder.cpp
# Opt level: O3

void __thiscall basic_coder::basic_coder(basic_coder *this,string *src,string *dst,size_t buf_sz)

{
  char cVar1;
  tree *this_00;
  runtime_error *this_01;
  pointer __p;
  __uniq_ptr_impl<tree,_std::default_delete<tree>_> local_30;
  
  std::ifstream::ifstream(this,(string *)src,_S_in|_S_bin);
  std::ofstream::ofstream(&this->dst_file,(string *)dst,_S_out|_S_bin);
  this->buffer_size = buf_sz;
  (this->h_tree)._M_t.super___uniq_ptr_impl<tree,_std::default_delete<tree>_>._M_t.
  super__Tuple_impl<0UL,_tree_*,_std::default_delete<tree>_>.super__Head_base<0UL,_tree_*,_false>.
  _M_head_impl = (tree *)0x0;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Source file doesn\'t exist");
  }
  else {
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      this_00 = (tree *)operator_new(0x70);
      tree::tree(this_00);
      local_30._M_t.super__Tuple_impl<0UL,_tree_*,_std::default_delete<tree>_>.
      super__Head_base<0UL,_tree_*,_false>._M_head_impl =
           (tuple<tree_*,_std::default_delete<tree>_>)
           (_Tuple_impl<0UL,_tree_*,_std::default_delete<tree>_>)0x0;
      std::__uniq_ptr_impl<tree,_std::default_delete<tree>_>::reset
                ((__uniq_ptr_impl<tree,_std::default_delete<tree>_> *)&this->h_tree,this_00);
      std::unique_ptr<tree,_std::default_delete<tree>_>::~unique_ptr
                ((unique_ptr<tree,_std::default_delete<tree>_> *)&local_30);
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Destination file name is invalid");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

basic_coder::basic_coder(const std::string &src, const std::string &dst, size_t buf_sz) :
        src_file(src, std::ios::in | std::ios::binary),
        dst_file(dst, std::ios::out | std::ios::binary),
        buffer_size(buf_sz) {
    if (!src_file.is_open())
        throw std::runtime_error("Source file doesn't exist");
    if (!dst_file.is_open())
        throw std::runtime_error("Destination file name is invalid");
    h_tree = std::unique_ptr<tree>(new tree());
}